

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

bool __thiscall
spirv_cross::Compiler::InterlockedResourceAccessHandler::begin_function_scope
          (InterlockedResourceAccessHandler *this,uint32_t *args,uint32_t length)

{
  size_t sVar1;
  
  if (2 < length) {
    if (args[2] == this->interlock_function_id) {
      this->call_stack_is_interlocked = true;
    }
    SmallVector<unsigned_int,_8UL>::reserve
              (&this->call_stack,(this->call_stack).super_VectorView<unsigned_int>.buffer_size + 1);
    sVar1 = (this->call_stack).super_VectorView<unsigned_int>.buffer_size;
    (this->call_stack).super_VectorView<unsigned_int>.ptr[sVar1] = args[2];
    (this->call_stack).super_VectorView<unsigned_int>.buffer_size = sVar1 + 1;
  }
  return 2 < length;
}

Assistant:

bool Compiler::InterlockedResourceAccessHandler::begin_function_scope(const uint32_t *args, uint32_t length)
{
	if (length < 3)
		return false;

	if (args[2] == interlock_function_id)
		call_stack_is_interlocked = true;

	call_stack.push_back(args[2]);
	return true;
}